

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O0

void highsSparseTranspose
               (HighsInt numRow,HighsInt numCol,vector<int,_std::allocator<int>_> *Astart,
               vector<int,_std::allocator<int>_> *Aindex,
               vector<double,_std::allocator<double>_> *Avalue,
               vector<int,_std::allocator<int>_> *ARstart,vector<int,_std::allocator<int>_> *ARindex
               ,vector<double,_std::allocator<double>_> *ARvalue)

{
  value_type vVar1;
  int iVar2;
  size_type __n;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  vector<int,_std::allocator<int>_> *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  int in_ESI;
  int in_EDI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  HighsInt iPut;
  HighsInt iRow;
  HighsInt k_1;
  HighsInt iCol;
  HighsInt i_1;
  HighsInt i;
  HighsInt k;
  HighsInt AcountX;
  vector<int,_std::allocator<int>_> iwork;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  value_type vVar8;
  value_type in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  vector<double,_std::allocator<double>_> *this;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar9;
  undefined4 in_stack_ffffffffffffff94;
  int iVar10;
  int local_68;
  int local_64;
  int local_60;
  undefined1 local_45 [29];
  vector<int,_std::allocator<int>_> *local_28;
  vector<double,_std::allocator<double>_> *local_20;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  int local_8;
  int local_4;
  
  __n = (size_type)in_EDI;
  local_45._1_4_ = 0;
  this = (vector<double,_std::allocator<double>_> *)local_45;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::allocator<int>::allocator((allocator<int> *)0x7ef419);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)this,__n,
             (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::allocator<int>::~allocator((allocator<int> *)0x7ef43e);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             (value_type_conflict2 *)this);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(local_18);
  std::vector<int,_std::allocator<int>_>::resize((vector<int,_std::allocator<int>_> *)this,__n);
  std::vector<double,_std::allocator<double>_>::resize(this,__n);
  for (local_60 = 0; local_60 < (int)sVar3; local_60 = local_60 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_60);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_45 + 5),(long)*pvVar4);
    *pvVar5 = *pvVar5 + 1;
  }
  for (local_64 = 1; local_64 <= local_4; local_64 = local_64 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)(local_64 + -1));
    in_stack_ffffffffffffff70 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_45 + 5),(long)(local_64 + -1));
    in_stack_ffffffffffffff74 = in_stack_ffffffffffffff70 + *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_64);
    *pvVar5 = in_stack_ffffffffffffff74;
  }
  for (local_68 = 0; local_68 < local_4; local_68 = local_68 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_68);
    vVar8 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_45 + 5),(long)local_68);
    *pvVar5 = vVar8;
  }
  for (iVar10 = 0; iVar10 < local_8; iVar10 = iVar10 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)iVar10);
    iVar2 = *pvVar4;
    while( true ) {
      iVar9 = iVar2;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)(iVar10 + 1));
      if (*pvVar4 <= iVar2) break;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)iVar9);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_45 + 5),(long)*pvVar4);
      iVar2 = *pvVar5;
      *pvVar5 = iVar2 + 1;
      vVar8 = iVar10;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,(long)iVar2);
      *pvVar5 = iVar10;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_20,(long)iVar9);
      vVar1 = *pvVar6;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_stack_00000010,(long)iVar2);
      *pvVar7 = vVar1;
      iVar2 = iVar9 + 1;
      iVar10 = vVar8;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  return;
}

Assistant:

void highsSparseTranspose(HighsInt numRow, HighsInt numCol,
                          const std::vector<HighsInt>& Astart,
                          const std::vector<HighsInt>& Aindex,
                          const std::vector<double>& Avalue,
                          std::vector<HighsInt>& ARstart,
                          std::vector<HighsInt>& ARindex,
                          std::vector<double>& ARvalue) {
  // Make a AR copy
  std::vector<HighsInt> iwork(numRow, 0);
  ARstart.resize(numRow + 1, 0);
  HighsInt AcountX = Aindex.size();
  ARindex.resize(AcountX);
  ARvalue.resize(AcountX);
  for (HighsInt k = 0; k < AcountX; k++) {
    assert(Aindex[k] < numRow);
    iwork[Aindex[k]]++;
  }
  for (HighsInt i = 1; i <= numRow; i++)
    ARstart[i] = ARstart[i - 1] + iwork[i - 1];
  for (HighsInt i = 0; i < numRow; i++) iwork[i] = ARstart[i];
  for (HighsInt iCol = 0; iCol < numCol; iCol++) {
    for (HighsInt k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
      HighsInt iRow = Aindex[k];
      HighsInt iPut = iwork[iRow]++;
      ARindex[iPut] = iCol;
      ARvalue[iPut] = Avalue[k];
    }
  }
}